

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O1

State * __thiscall despot::RegDemo::CreateStartState(RegDemo *this,string type)

{
  State *this_00;
  double dVar1;
  
  dVar1 = (double)despot::Random::NextDouble();
  this_00 = (State *)operator_new(0x20);
  despot::State::State(this_00);
  *(undefined ***)this_00 = &PTR__State_0010daa8;
  *(uint *)(this_00 + 0xc) = (uint)(0.5 < dVar1);
  return this_00;
}

Assistant:

State* RegDemo::CreateStartState(string type) const {
	double prob = Random::RANDOM.NextDouble();
	return new RegDemoState((prob <= 0.5) ? 0 : 1);
}